

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourceDirectional::~IfcLightSourceDirectional
          (IfcLightSourceDirectional *this)

{
  long *plVar1;
  _func_int *p_Var2;
  
  p_Var2 = (this->super_IfcLightSource).super_IfcGeometricRepresentationItem.
           super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper[-3];
  plVar1 = (long *)(&(this->super_IfcLightSource).field_0x40 + (long)p_Var2);
  plVar1[-8] = 0x85d9b0;
  plVar1[0xb] = 0x85da28;
  plVar1[-6] = 0x85d9d8;
  plVar1[-4] = 0x85da00;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  operator_delete((_func_int *)
                  ((long)&(this->super_IfcLightSource).super_IfcGeometricRepresentationItem.
                          super_IfcRepresentationItem.
                          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                          _vptr_ObjectHelper + (long)p_Var2),0xb0);
  return;
}

Assistant:

IfcLightSourceDirectional() : Object("IfcLightSourceDirectional") {}